

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

int Cbs2_ManPropagate2(Cbs2_Man_t *p,int Level)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iFanout;
  int hClause;
  int iFan;
  int iLit;
  int i;
  int Level_local;
  Cbs2_Man_t *p_local;
  
  iFan = (p->pProp).iHead;
  while( true ) {
    bVar3 = false;
    if (iFan < (p->pProp).iTail) {
      hClause = (p->pProp).pData[iFan];
      bVar3 = hClause != 0;
    }
    if (!bVar3) {
      (p->pProp).iHead = (p->pProp).iTail;
      return 0;
    }
    iVar1 = Cbs2_ManPropagateClauses(p,Level,hClause);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = Abc_Lit2Var(hClause);
    for (iFanout = Vec_IntEntry(&p->vFanout0,iVar1); iFanout != 0;
        iFanout = Vec_IntEntry(&p->vFanoutN,iFanout)) {
      iVar1 = Abc_Lit2Var(iFanout);
      iVar2 = Cbs2_VarIsAssigned(p,iVar1);
      if (iVar2 == 0) {
        Cbs2_ManPropagateUnassigned(p,iVar1,Level);
      }
      else {
        iVar1 = Cbs2_ManPropagateOne(p,iVar1,Level);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
    }
    iVar1 = Abc_Lit2Var(hClause);
    iVar1 = Cbs2_ManPropagateOne(p,iVar1,Level);
    if (iVar1 != 0) break;
    iFan = iFan + 1;
  }
  return iVar1;
}

Assistant:

int Cbs2_ManPropagate2( Cbs2_Man_t * p, int Level )
{
    int i, iLit, iFan, hClause;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
    {
        if ( (hClause = Cbs2_ManPropagateClauses(p, Level, iLit)) )
            return hClause;
        Cbs2_ObjForEachFanout( p, Abc_Lit2Var(iLit), iFan )
        {
            int iFanout = Abc_Lit2Var(iFan);
            if ( !Cbs2_VarIsAssigned(p, iFanout) )
                Cbs2_ManPropagateUnassigned( p, iFanout, Level );
            else if ( (hClause = Cbs2_ManPropagateOne(p, iFanout, Level)) )
                return hClause;
        }
        if ( (hClause = Cbs2_ManPropagateOne( p, Abc_Lit2Var(iLit), Level )) )
            return hClause;
    }
    p->pProp.iHead = p->pProp.iTail;
    return 0;
}